

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

int bitstream_r_read(bitstream_r *stream,uint64_t *dst,int32_t bits)

{
  ulong uVar1;
  ulong uVar2;
  ulong local_58;
  uint64_t result;
  uint8_t *buffer;
  size_t bit_end;
  size_t bit_start;
  size_t size;
  size_t offset;
  int32_t bits_local;
  uint64_t *dst_local;
  bitstream_r *stream_local;
  
  if (bits < 1) {
    *dst = 0;
    stream_local._4_4_ = 0;
  }
  else if (bits < 0x39) {
    uVar1 = stream->bit_offset;
    size = uVar1 >> 3;
    bit_start = (uVar1 + (long)bits + 7 >> 3) - size;
    if (stream->length < size + bit_start) {
      stream_local._4_4_ = -1;
    }
    else {
      stream->bit_offset = (long)bits + stream->bit_offset;
      uVar2 = uVar1 + (long)bits & 7;
      local_58 = (ulong)*(byte *)((long)stream->ptr + size);
      if ((uVar1 & 7) != 0) {
        local_58 = (long)(0xff >> (sbyte)(uVar1 & 7)) & local_58;
      }
      for (; 1 < bit_start; bit_start = bit_start - 1) {
        size = size + 1;
        local_58 = local_58 << 8 | (ulong)*(byte *)((long)stream->ptr + size);
      }
      if (uVar2 != 0) {
        local_58 = local_58 >> (8U - (char)uVar2 & 0x3f);
      }
      *dst = local_58;
      stream_local._4_4_ = 0;
    }
  }
  else {
    stream_local._4_4_ = -1;
  }
  return stream_local._4_4_;
}

Assistant:

int
bitstream_r_read(struct bitstream_r *stream, uint64_t *dst, int32_t bits) {
  size_t offset, size, bit_start, bit_end;
  const uint8_t *buffer;
  uint64_t result;

  if (bits <= 0) {
    *dst = 0;
    return 0;
  }

  if (bits > 56) {
    return -1;
  }

  buffer = stream->ptr;

  /* copy range */
  bit_start = stream->bit_offset;
  bit_end = bit_start + bits;

  /* calculate offset */
  offset = bit_start / 8;
  size = (bit_end + 7) / 8 - offset;

  /* check range */
  if (offset + size > stream->length) {
    return -1;
  }

  /* advance pointer */
  stream->bit_offset += bits;

  /* truncate bit positions */
  bit_start = bit_start & 7;
  bit_end = bit_end & 7;

  /* copy first byte */
  result = buffer[offset];
  if (bit_start != 0) {
    result &= (0xFF >> bit_start);
  }

  while (size > 1) {
    offset++;
    size--;

    result = (result << 8) | buffer[offset];
  }

  if (bit_end != 0) {
    result >>= (8 - bit_end);
  }

  *dst = result;
  return 0;
}